

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

err_t MATROSKA_LinkBlockWriteSegmentInfo(matroska_block *Block,ebml_master *SegmentInfo)

{
  ebml_context *Context;
  bool_t bVar1;
  ebml_master *local_18;
  
  local_18 = SegmentInfo;
  Context = MATROSKA_getContextInfo();
  bVar1 = EBML_ElementIsType(&SegmentInfo->Base,Context);
  if (bVar1 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)SegmentInfo, MATROSKA_getContextInfo())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x201,"err_t MATROSKA_LinkBlockWriteSegmentInfo(matroska_block *, ebml_master *)"
                 );
  }
  bVar1 = Node_IsPartOf(Block,0x4c424b4d);
  if (bVar1 != 0) {
    if (Block != (matroska_block *)0x0) {
      (**(code **)((long)(Block->Base).Base.Base.Base.VMT + 0x20))(Block,0x183,&local_18,8);
      return 0;
    }
    __assert_fail("(const void*)(Block)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x203,"err_t MATROSKA_LinkBlockWriteSegmentInfo(matroska_block *, ebml_master *)"
                 );
  }
  __assert_fail("Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS)",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x202,"err_t MATROSKA_LinkBlockWriteSegmentInfo(matroska_block *, ebml_master *)");
}

Assistant:

err_t MATROSKA_LinkBlockWriteSegmentInfo(matroska_block *Block, ebml_master *SegmentInfo)
{
    assert(EBML_ElementIsType((ebml_element*)SegmentInfo, MATROSKA_getContextInfo()));
    assert(Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS));
    Node_SET(Block,MATROSKA_BLOCK_WRITE_SEGMENTINFO,&SegmentInfo);
    return ERR_NONE;
}